

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int z;
  char *pcVar2;
  allocator local_1b6;
  char input_lable;
  int local_1b4;
  string local_1b0 [32];
  M_tree mtree_head;
  char check_fold [100];
  
  local_1b4 = argc;
  if (argc == 1 || 3 < argc) {
    puts("error parameters");
  }
  else {
    M_tree::M_tree(&mtree_head);
    do {
      poVar1 = std::operator<<((ostream *)&std::cout,"1. Building the M_tree.");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"2. Updating the M_tree.");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "3. Checking the difference between two folder.");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"Please input 1~3 to using these function!");
      std::endl<char,std::char_traits<char>>(poVar1);
      std::operator>>((istream *)&std::cin,&input_lable);
      if (input_lable == '1') {
        poVar1 = std::operator<<((ostream *)&std::cout,
                                 "**************** We are building the Merkle tree. Please wait... ****************"
                                );
        std::endl<char,std::char_traits<char>>(poVar1);
        std::__cxx11::string::string(local_1b0,argv[1],&local_1b6);
        std::__cxx11::string::operator=((string *)&mtree_head.folder_name1,local_1b0);
        std::__cxx11::string::~string(local_1b0);
        z = 1;
        M_tree::build(&mtree_head,argv[1],1);
LAB_001026b5:
        M_tree::show(&mtree_head,1,z);
      }
      else {
        if (input_lable == '2') {
          poVar1 = std::operator<<((ostream *)&std::cout,
                                   "**************** We are updating the Merkle tree. Please wait... ****************"
                                  );
          std::endl<char,std::char_traits<char>>(poVar1);
          M_tree::update(&mtree_head);
          z = 2;
          goto LAB_001026b5;
        }
        if (input_lable == '3') {
          M_tree::build(&mtree_head,argv[1],1);
          std::__cxx11::string::string(local_1b0,argv[1],&local_1b6);
          std::__cxx11::string::operator=((string *)&mtree_head.folder_name1,local_1b0);
          std::__cxx11::string::~string(local_1b0);
          if (local_1b4 == 2) {
            poVar1 = std::operator<<((ostream *)&std::cout,
                                     "Please input the address, we will check their difference.");
            std::endl<char,std::char_traits<char>>(poVar1);
            std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&std::cin,check_fold);
            std::__cxx11::string::string(local_1b0,check_fold,&local_1b6);
            std::__cxx11::string::operator=((string *)&mtree_head.folder_name2,local_1b0);
            std::__cxx11::string::~string(local_1b0);
            M_tree::build(&mtree_head,check_fold,3);
          }
          else {
            std::__cxx11::string::string(local_1b0,argv[2],&local_1b6);
            std::__cxx11::string::operator=((string *)&mtree_head.folder_name2,local_1b0);
            std::__cxx11::string::~string(local_1b0);
            M_tree::build(&mtree_head,argv[2],3);
          }
          poVar1 = std::operator<<((ostream *)&std::cout,
                                   "**************** We are checking the difference. Please wait... ****************"
                                  );
          std::endl<char,std::char_traits<char>>(poVar1);
          M_tree::compare(&mtree_head);
        }
        else {
          pcVar2 = "Thanks for your using. Good bye~";
          if (input_lable != 'q') {
            pcVar2 = "You inputed a wrong alphabet, Please input again.";
          }
          poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
          std::endl<char,std::char_traits<char>>(poVar1);
        }
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    } while (input_lable != 'q');
    M_tree::~M_tree(&mtree_head);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    if(argc == 1 || argc > 3) {
        puts("error parameters");
        return 0;
    }

    //含程序自身参数，总参数数为2时，第2个参数为用于构建默克尔树的目录
    //含程序自身参数，总参数数为3时，第2个参数为用于构建默克尔树的目录，第3个参数为用于构建默克尔树和比较一致性的目录，
    //相关逻辑自行补充

    M_tree mtree_head;
    char input_lable;
    char check_fold[100];

    while(1) //整体实验大循环，完成实验3-1至3-4
    {
        //初始化创建叶子节点，注意根据目录下文件数分配空间
        //initalize_leaf函数，输出Node类型的数组，每个叶子节点的key可使用文件名，哈希值为文件所有数据的哈希，叶子节点初始化时，父节点、左右子节点为空，数据结构参考前述数据结构。未初始化时，key值可以设成-1.
        //hash函数可以是MD5，也可以是SHA-256，或自行设计哈希函数
        cout << "1. Building the M_tree." << endl;
        cout << "2. Updating the M_tree." << endl;
        cout << "3. Checking the difference between two folder." << endl;
        cout << "Please input 1~3 to using these function!" << endl;
        cin >> input_lable;
        switch(input_lable){
            case '1':
            {
                cout << "**************** We are building the Merkle tree. Please wait... ****************" << endl;
                mtree_head.folder_name1 = string(argv[1]);
                mtree_head.build(argv[1], 1);
                mtree_head.show(1, 1);
                break;
            }
            case '2':
            {
                cout << "**************** We are updating the Merkle tree. Please wait... ****************" << endl;
                mtree_head.update();
                mtree_head.show(1, 2);
                break;
            }
            case '3':
            {
                mtree_head.build(argv[1], 1);
                mtree_head.folder_name1 = string(argv[1]);
                if(argc == 2){
                    cout << "Please input the address, we will check their difference." << endl;
                    cin >> check_fold;
                    mtree_head.folder_name2 = string(check_fold);
                    mtree_head.build(check_fold, 3);
                }
                else{
                    mtree_head.folder_name2 = string(argv[2]);
                    mtree_head.build(argv[2], 3);
                }
                cout << "**************** We are checking the difference. Please wait... ****************" << endl;
                mtree_head.compare();
                break;
            }
            case 'q':
            {
                cout << "Thanks for your using. Good bye~" << endl;
                break;
            }
            default:{
                cout << "You inputed a wrong alphabet, Please input again." << endl;
            }
        }
        cout << endl;
        if(input_lable == 'q'){
            break;
        }
    }//结束大循环
}